

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O0

void print_symbol(TextBuffer *buf,LuaSymbol *sym,int level)

{
  StringObject *pSVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int level_local;
  LuaSymbol *sym_local;
  TextBuffer *buf_local;
  
  switch(sym->symbol_type) {
  case SYM_LOCAL:
    pSVar1 = (sym->field_1).variable.var_name;
    pcVar3 = raviX_get_type_name((sym->field_1).variable.value_type.type_code);
    pcVar4 = get_as_str((StringObject *)(sym->field_1).label.block);
    pcVar5 = " const";
    if ((*(byte *)((long)&sym->field_1 + 0x28) >> 2 & 1) != 0) {
      pcVar5 = "";
    }
    printf_buf(buf,"%p%t %c %s %s %s\n",(ulong)(uint)level,pSVar1,"local symbol",pcVar3,pcVar4,
               pcVar5);
    break;
  case SYM_UPVALUE:
    uVar2 = *(undefined8 *)((long)&((sym->field_1).label.pseudo)->field_3 + 0x10);
    pcVar3 = raviX_get_type_name(((sym->field_1).variable.var_name)->hash);
    pcVar4 = get_as_str((StringObject *)((sym->field_1).variable.var_name)->str);
    printf_buf(buf,"%p%t %c %s %s\n",(ulong)(uint)level,uVar2,"upvalue",pcVar3,pcVar4);
    break;
  case SYM_GLOBAL:
    pSVar1 = (sym->field_1).variable.var_name;
    pcVar3 = raviX_get_type_name((sym->field_1).variable.value_type.type_code);
    pcVar4 = get_as_str((StringObject *)(sym->field_1).label.block);
    printf_buf(buf,"%p%t %c %s %s\n",(ulong)(uint)level,pSVar1,"global symbol",pcVar3,pcVar4);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_printer.c"
                  ,0xaa,"void print_symbol(TextBuffer *, LuaSymbol *, int)");
  case SYM_ENV:
    pSVar1 = (sym->field_1).variable.var_name;
    pcVar3 = raviX_get_type_name((sym->field_1).variable.value_type.type_code);
    pcVar4 = get_as_str((StringObject *)(sym->field_1).label.block);
    printf_buf(buf,"%p%t %c %s %s\n",(ulong)(uint)level,pSVar1,"_ENV",pcVar3,pcVar4);
  }
  return;
}

Assistant:

static void print_symbol(TextBuffer *buf, LuaSymbol *sym, int level)
{
	switch (sym->symbol_type) {
	case SYM_ENV: {
		printf_buf(buf, "%p%t %c %s %s\n", level, sym->variable.var_name, "_ENV",
			   raviX_get_type_name(sym->variable.value_type.type_code), get_as_str(sym->variable.value_type.type_name));
		break;
	}
	case SYM_GLOBAL: {
		printf_buf(buf, "%p%t %c %s %s\n", level, sym->variable.var_name, "global symbol",
			   raviX_get_type_name(sym->variable.value_type.type_code), get_as_str(sym->variable.value_type.type_name));
		break;
	}
	case SYM_LOCAL: {
		printf_buf(buf, "%p%t %c %s %s %s\n", level, sym->variable.var_name, "local symbol",
			   raviX_get_type_name(sym->variable.value_type.type_code), get_as_str(sym->variable.value_type.type_name),
			   (sym->variable.modified ? "" : " const"));
		break;
	}
	case SYM_UPVALUE: {
		printf_buf(buf, "%p%t %c %s %s\n", level, sym->upvalue.target_variable->variable.var_name, "upvalue",
			   raviX_get_type_name(sym->upvalue.target_variable->variable.value_type.type_code),
			   get_as_str(sym->upvalue.target_variable->variable.value_type.type_name));
		break;
	}
	default:
		assert(0);
	}
}